

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O2

BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
* __thiscall
Js::JavascriptSet::
CreateVarSetFromList<JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
          (JavascriptSet *this,uint initialCapacity)

{
  MapOrSetDataList<void_*> *key;
  bool bVar1;
  Recycler *pRVar2;
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined1 local_58 [8];
  Iterator iter;
  WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_> local_30;
  
  pRVar2 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  local_58 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  iter.list.ptr = (MapOrSetDataList<void_*> *)0x0;
  iter.current.ptr = (MapOrSetDataNode<void_*> *)0xffffffffffffffff;
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_58);
  this_00 = (BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar2,0x37a1d4);
  pRVar2 = RecyclableObject::GetRecycler((RecyclableObject *)this);
  JsUtil::
  BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::SameValueZeroComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,pRVar2,initialCapacity);
  MapOrSetDataList<void_*>::Iterator::Iterator((Iterator *)local_58,&this->list);
  while( true ) {
    bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)local_58);
    if (!bVar1) break;
    key = iter.list.ptr + 1;
    Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>::WriteBarrierSet
              (&local_30,(MapOrSetDataNode<void_*> *)iter.list.ptr);
    JsUtil::
    BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_00,(void **)key,&local_30.ptr);
  }
  return this_00;
}

Assistant:

T*
JavascriptSet::CreateVarSetFromList(uint initialCapacity)
{
    T* varSet = RecyclerNew(this->GetRecycler(), T, this->GetRecycler(), initialCapacity);

    JavascriptSet::SetDataList::Iterator iter = this->list.GetIterator();
    // TODO: we can use a more efficient Iterator, since we know there will be no side effects
    while (iter.Next())
    {
        varSet->Add(iter.Current(), iter.CurrentNode());
    }
    return varSet;
}